

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::BeginDisabled(bool disabled)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  bool was_disabled;
  ImGuiContext *g;
  bool disabled_local;
  
  pIVar1 = GImGui;
  bVar2 = (GImGui->CurrentItemFlags & 4U) != 0;
  if ((!bVar2) && (disabled)) {
    GImGui->DisabledAlphaBackup = (GImGui->Style).Alpha;
    (pIVar1->Style).Alpha = (pIVar1->Style).DisabledAlpha * (pIVar1->Style).Alpha;
  }
  if ((bVar2) || (disabled)) {
    pIVar1->CurrentItemFlags = pIVar1->CurrentItemFlags | 4;
  }
  ImVector<int>::push_back(&pIVar1->ItemFlagsStack,&pIVar1->CurrentItemFlags);
  pIVar1->DisabledStackSize = pIVar1->DisabledStackSize + 1;
  return;
}

Assistant:

void ImGui::BeginDisabled(bool disabled)
{
    ImGuiContext& g = *GImGui;
    bool was_disabled = (g.CurrentItemFlags & ImGuiItemFlags_Disabled) != 0;
    if (!was_disabled && disabled)
    {
        g.DisabledAlphaBackup = g.Style.Alpha;
        g.Style.Alpha *= g.Style.DisabledAlpha; // PushStyleVar(ImGuiStyleVar_Alpha, g.Style.Alpha * g.Style.DisabledAlpha);
    }
    if (was_disabled || disabled)
        g.CurrentItemFlags |= ImGuiItemFlags_Disabled;
    g.ItemFlagsStack.push_back(g.CurrentItemFlags);
    g.DisabledStackSize++;
}